

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::FullyConnectedLayer::calcPropagatedErrors(FullyConnectedLayer *this)

{
  size_t sVar1;
  element_type *peVar2;
  size_t sVar3;
  float *__s;
  float *pfVar4;
  float *pfVar5;
  size_t sVar6;
  float *pfVar7;
  size_t sVar8;
  float fVar9;
  
  sVar1 = this->nInputs;
  __s = (this->propagatedErrors)._M_data;
  if ((this->propagatedErrors)._M_size != sVar1) {
    operator_delete(__s);
    (this->propagatedErrors)._M_size = sVar1;
    __s = (float *)operator_new(sVar1 * 4);
    (this->propagatedErrors)._M_data = __s;
    if (sVar1 != 0) {
      memset(__s,0,sVar1 * 4);
    }
  }
  if ((this->propagatedErrors)._M_size == 0) {
    __s = (float *)0x0;
  }
  peVar2 = (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pfVar4 = (float *)peVar2->_M_size;
  if (pfVar4 != (float *)0x0) {
    pfVar4 = peVar2->_M_data;
  }
  sVar1 = this->nInputs;
  pfVar5 = (float *)(this->localGrad)._M_size;
  if (pfVar5 != (float *)0x0) {
    pfVar5 = (this->localGrad)._M_data;
  }
  if (sVar1 != 0) {
    sVar3 = this->nOutputs;
    sVar6 = 0;
    do {
      if (sVar3 == 0) {
        fVar9 = 0.0;
      }
      else {
        fVar9 = 0.0;
        sVar8 = 0;
        pfVar7 = pfVar4;
        do {
          fVar9 = fVar9 + *pfVar7 * pfVar5[sVar8];
          sVar8 = sVar8 + 1;
          pfVar7 = pfVar7 + sVar1;
        } while (sVar3 != sVar8);
      }
      __s[sVar6] = fVar9;
      sVar6 = sVar6 + 1;
      pfVar4 = pfVar4 + 1;
    } while (sVar6 != sVar1);
  }
  return;
}

Assistant:

void calcPropagatedErrors() {
        if (propagatedErrors.size() != nInputs) {
            propagatedErrors.resize(nInputs);
        }
        // propagated errors are dot products between columns of the
        // weight matrix $w_{kj} and local gradient $\\delta_j$;
        auto e_begin = std::begin(propagatedErrors); // points to e_0
        auto w_begin = std::begin(*weights);         // points to w_00
        auto delta_begin = std::begin(localGrad);    // points to delta_0
        for (size_t j = 0; j < nInputs; ++j) { // for all inputs
            float &e_j = *(e_begin + j);
            e_j = internal::dot(nOutputs, w_begin + j, nInputs, delta_begin, 1);
        }
    }